

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_finalize_nolock_(event_base *base,uint flags,event *ev,event_finalize_callback_fn cb)

{
  uint8_t uVar1;
  uint8_t closure;
  event_finalize_callback_fn cb_local;
  event *ev_local;
  uint flags_local;
  event_base *base_local;
  
  uVar1 = '\x05';
  if ((flags & 0x10000) != 0) {
    uVar1 = '\x06';
  }
  event_del_nolock_(ev,0);
  (ev->ev_evcallback).evcb_closure = uVar1;
  (ev->ev_evcallback).evcb_cb_union.evcb_callback = (_func_void_int_short_void_ptr *)cb;
  event_active_nolock_(ev,0x40,1);
  (ev->ev_evcallback).evcb_flags = (ev->ev_evcallback).evcb_flags | 0x40;
  return 0;
}

Assistant:

static int
event_finalize_nolock_(struct event_base *base, unsigned flags, struct event *ev, event_finalize_callback_fn cb)
{
	ev_uint8_t closure = (flags & EVENT_FINALIZE_FREE_) ?
	    EV_CLOSURE_EVENT_FINALIZE_FREE : EV_CLOSURE_EVENT_FINALIZE;

	event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
	ev->ev_closure = closure;
	ev->ev_evcallback.evcb_cb_union.evcb_evfinalize = cb;
	event_active_nolock_(ev, EV_FINALIZE, 1);
	ev->ev_flags |= EVLIST_FINALIZING;
	return 0;
}